

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O2

Result<wasm::Type> * __thiscall
wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::makeTupleType
          (Result<wasm::Type> *__return_storage_ptr__,
          TypeParserCtx<wasm::WATParser::ParseDefsCtx> *this,
          vector<wasm::Type,_std::allocator<wasm::Type>_> *types)

{
  _Vector_base<wasm::Type,_std::allocator<wasm::Type>_> local_30;
  
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&local_30,types);
  std::__detail::__variant::_Variant_storage<false,wasm::Type,wasm::Err>::
  _Variant_storage<0ul,std::vector<wasm::Type,std::allocator<wasm::Type>>>
            ((_Variant_storage<false,wasm::Type,wasm::Err> *)__return_storage_ptr__,&local_30);
  std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base(&local_30);
  return __return_storage_ptr__;
}

Assistant:

Result<TypeT> makeTupleType(const std::vector<Type>& types) {
    return Tuple(types);
  }